

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_NewScObject_A_Impl
          (InterpreterStackFrame *this,OpLayoutAuxiliary *playout,RegSlot *target)

{
  uint offset;
  int32 iVar1;
  FunctionBody *functionBody;
  VarArrayVarCount *pVVar2;
  Var pvVar3;
  Var newVarInstance;
  int i;
  int count;
  VarArrayVarCount *vars;
  RegSlot *target_local;
  OpLayoutAuxiliary *playout_local;
  InterpreterStackFrame *this_local;
  
  offset = (playout->super_OpLayoutAuxNoReg).Offset;
  functionBody = GetFunctionBody(this);
  pVVar2 = ByteCodeReader::ReadVarArrayVarCount(offset,functionBody);
  iVar1 = TaggedInt::ToInt32(pVVar2->count);
  for (newVarInstance._0_4_ = 0; (int)newVarInstance < iVar1;
      newVarInstance._0_4_ = (int)newVarInstance + 1) {
    SetOut(this,(short)(int)newVarInstance + 1,pVVar2[(long)(int)newVarInstance + 1].count);
  }
  pvVar3 = GetReg<unsigned_int>(this,(playout->super_OpLayoutAuxNoReg).C1);
  pvVar3 = NewScObject_Helper(this,pvVar3,(short)iVar1 + 1,(AuxArray<unsigned_int> *)0x0);
  SetReg<unsigned_int>(this,playout->R0,pvVar3);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScObject_A_Impl(const unaligned OpLayoutAuxiliary * playout, RegSlot *target)
    {
        const Js::VarArrayVarCount * vars = Js::ByteCodeReader::ReadVarArrayVarCount(playout->Offset, this->GetFunctionBody());

        int count = Js::TaggedInt::ToInt32(vars->count);

        // Push the parameters to stack
        for (int i = 0; i < count; i++)
        {
            SetOut((ArgSlot)(i + 1), vars->elements[i]);
        }

        Var newVarInstance = NewScObject_Helper(GetReg((RegSlot)playout->C1), (ArgSlot)count + 1);
        SetReg((RegSlot)playout->R0, newVarInstance);

    }